

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
          (QAbstractGraphicsShapeItem *this,QGraphicsItem *parent)

{
  undefined1 *puVar1;
  QGraphicsItemPrivate *pQVar2;
  long lVar3;
  qreal *pqVar4;
  QTransform *pQVar5;
  byte bVar6;
  
  bVar6 = 0;
  pQVar2 = (QGraphicsItemPrivate *)operator_new(0x1a8);
  pQVar2->_vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QGraphicsItemPrivate_0081f428;
  (pQVar2->extras).d.d = (Data *)0x0;
  (pQVar2->extras).d.ptr = (ExtraStruct *)0x0;
  (pQVar2->extras).d.size = 0;
  (pQVar2->childrenBoundingRect).xp = 0.0;
  (pQVar2->childrenBoundingRect).yp = 0.0;
  (pQVar2->childrenBoundingRect).w = 0.0;
  (pQVar2->childrenBoundingRect).h = 0.0;
  (pQVar2->needsRepaint).xp = 0.0;
  (pQVar2->needsRepaint).yp = 0.0;
  (pQVar2->needsRepaint).w = 0.0;
  (pQVar2->needsRepaint).h = 0.0;
  (pQVar2->paintedViewBoundingRects).d = (Data *)0x0;
  (pQVar2->pos).xp = 0.0;
  (pQVar2->pos).yp = 0.0;
  pQVar2->z = 0.0;
  pQVar2->opacity = 1.0;
  pQVar2->scene = (QGraphicsScene *)0x0;
  pQVar2->parent = (QGraphicsItem *)0x0;
  (pQVar2->children).d.d = (Data *)0x0;
  (pQVar2->children).d.ptr = (QGraphicsItem **)0x0;
  (pQVar2->children).d.size = 0;
  pQVar2->transformData = (TransformData *)0x0;
  pQVar2->graphicsEffect = (QGraphicsEffect *)0x0;
  pqVar4 = (qreal *)&DAT_00700e28;
  pQVar5 = &pQVar2->sceneTransform;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    pQVar5->m_matrix[0][0] = *pqVar4;
    pqVar4 = pqVar4 + (ulong)bVar6 * -2 + 1;
    pQVar5 = (QTransform *)((long)pQVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  puVar1 = &(pQVar2->sceneTransform).field_0x48;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
  pQVar2->index = -1;
  pQVar2->siblingIndex = -1;
  pQVar2->itemDepth = -1;
  pQVar2->focusProxy = (QGraphicsItem *)0x0;
  (pQVar2->focusProxyRefs).d.d = (Data *)0x0;
  (pQVar2->focusProxyRefs).d.ptr = (QGraphicsItem ***)0x0;
  (pQVar2->focusProxyRefs).d.size = 0;
  pQVar2->subFocusItem = (QGraphicsItem *)0x0;
  pQVar2->focusScopeItem = (QGraphicsItem *)0x0;
  pQVar2->imHints = (QFlagsStorageHelper<Qt::InputMethodHint,_4>)0x0;
  pQVar2->panelModality = NonModal;
  (pQVar2->gestureContext).d.d.ptr =
       (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
        *)0x0;
  *(undefined8 *)&pQVar2->field_0x160 = 0x600000000000bf;
  *(uint *)&pQVar2->field_0x168 = *(uint *)&pQVar2->field_0x168 & 0xfffff000 | 0x822;
  pQVar2->globalStackingOrder = -1;
  pQVar2->q_ptr = (QGraphicsItem *)0x0;
  pQVar2->_vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QAbstractGraphicsShapeItemPrivate_00820888;
  QBrush::QBrush((QBrush *)(pQVar2 + 1));
  QPen::QPen((QPen *)&pQVar2[1].extras);
  pQVar2[1].childrenBoundingRect.xp = 0.0;
  pQVar2[1].childrenBoundingRect.yp = 0.0;
  pQVar2[1].extras.d.ptr = (ExtraStruct *)0x0;
  pQVar2[1].extras.d.size = 0;
  (this->super_QGraphicsItem)._vptr_QGraphicsItem = (_func_int **)&PTR__QGraphicsPixmapItem_0081f4c0
  ;
  (this->super_QGraphicsItem).d_ptr.d = pQVar2;
  pQVar2->q_ptr = &this->super_QGraphicsItem;
  QGraphicsItem::setParentItem(&this->super_QGraphicsItem,parent);
  (this->super_QGraphicsItem)._vptr_QGraphicsItem = (_func_int **)&PTR__QGraphicsPixmapItem_0081f7a0
  ;
  return;
}

Assistant:

QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(QGraphicsItem *parent)
    : QGraphicsItem(*new QAbstractGraphicsShapeItemPrivate, parent)
{
}